

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  int iVar1;
  SyntaxNode *this_00;
  SimplePragmaExpressionSyntax *pSVar2;
  size_t sVar3;
  Diagnostic *this_01;
  char *__s1;
  size_type __rlen;
  ulong uVar4;
  size_t index;
  string_view arg;
  SourceRange SVar5;
  
  uVar4 = (pragma->args).elements.size_ + 1;
  if (1 < uVar4) {
    index = 0;
    do {
      this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                 operator[](&pragma->args,index)->super_SyntaxNode;
      if ((this_00->kind == SimplePragmaExpression) &&
         (pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                             (this_00), (pSVar2->value).kind == Identifier)) {
        arg = Token::rawText(&pSVar2->value);
        __s1 = arg._M_str;
        sVar3 = arg._M_len;
        if ((long)sVar3 < 7) {
          if (sVar3 == 0) goto LAB_0019c799;
LAB_0019c7ce:
          if (sVar3 == 4) {
            iVar1 = bcmp(__s1,"once",4);
            goto joined_r0x0019c804;
          }
LAB_0019c806:
          SVar5 = Token::range(&pSVar2->value);
          this_01 = addDiag(this,(DiagCode)0x2b0004,SVar5);
          Diagnostic::operator<<(this_01,arg);
        }
        else if (sVar3 == 10) {
          iVar1 = bcmp(__s1,"diagnostic",10);
joined_r0x0019c804:
          if (iVar1 != 0) goto LAB_0019c806;
        }
        else {
          if (sVar3 != 7) goto LAB_0019c806;
          iVar1 = bcmp(__s1,"protect",7);
          if (iVar1 != 0) goto LAB_0019c7ce;
        }
        if ((sVar3 == 7) && (iVar1 = bcmp(__s1,"protect",7), iVar1 == 0)) {
          this->protectEncryptDepth = 0;
          this->protectDecryptDepth = 0;
          this->protectLineLength = 0;
          this->protectBytes = 0;
          this->protectEncoding = Raw;
        }
      }
      else {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(this_00);
        addDiag(this,(DiagCode)0x90004,SVar5);
      }
LAB_0019c799:
      index = index + 1;
    } while (uVar4 >> 1 != index);
  }
  return;
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}